

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O2

bool __thiscall
gss::innards::HomomorphismModel::initialise_domains
          (HomomorphismModel *this,
          vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
          *domains)

{
  uint *puVar1;
  Proof *pPVar2;
  pointer pHVar3;
  pointer piVar4;
  Lackey *this_00;
  undefined4 uVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  reference pvVar9;
  reference pvVar10;
  reference this_01;
  reference pvVar11;
  ulong __n;
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var12;
  bool bVar13;
  pointer pHVar14;
  uint g;
  uint t;
  size_type sVar15;
  uint i;
  ulong uVar16;
  vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
  *__range2;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  patterns_ndss;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  hall_rhs;
  vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  targets_ndss;
  SVOBitset ni;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  hall_lhs;
  SVOBitset dd;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  local_1d0;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b8;
  size_type local_1a0;
  vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  local_198;
  undefined1 local_180 [24];
  code *local_168;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  undefined1 local_e0 [136];
  undefined1 local_58 [40];
  
  uVar8 = *(uint *)((long)((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                          _M_head_impl)->params + 0x1c);
  if (uVar8 != 1) {
    uVar8 = this->max_graphs;
  }
  uVar16 = (ulong)uVar8;
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector(&local_1d0,uVar16,(allocator_type *)local_180);
  std::
  vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::vector(&local_198,uVar16,(allocator_type *)local_180);
  bVar6 = degree_and_nds_are_preserved
                    (((this->_imp)._M_t.
                      super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                     _M_head_impl)->params);
  if ((bVar6) &&
     (*(char *)((long)((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                      _M_head_impl)->params + 0x8a) == '\0')) {
    for (sVar15 = 0; uVar16 != sVar15; sVar15 = sVar15 + 1) {
      pvVar10 = std::
                vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                ::at(&local_1d0,sVar15);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::resize(pvVar10,(ulong)this->pattern_size);
      this_01 = std::
                vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                ::at(&local_198,sVar15);
      std::
      vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
      ::resize(this_01,(ulong)this->target_size);
    }
    sVar15 = 0;
    while( true ) {
      if ((uint)sVar15 == uVar8) break;
      uVar16 = 0;
      local_1a0 = sVar15;
      while( true ) {
        if (this->pattern_size <= uVar16) break;
        SVOBitset::SVOBitset
                  ((SVOBitset *)local_180,
                   (SVOBitset *)
                   ((ulong)(this->max_graphs * (int)uVar16 + (int)local_1a0) * 0x88 +
                   *(long *)&(((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                               .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                              ._M_head_impl)->pattern_graph_rows).
                             super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                   ));
        while( true ) {
          uVar7 = SVOBitset::find_first((SVOBitset *)local_180);
          if (uVar7 == 0xffffffff) break;
          SVOBitset::reset((SVOBitset *)local_180,uVar7);
          pvVar10 = std::
                    vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                    ::at(&local_1d0,sVar15);
          pvVar11 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::at(pvVar10,uVar16);
          local_e0._0_4_ =
               *(uint *)(*(long *)(*(long *)&(((this->_imp)._M_t.
                                               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               .
                                               super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                              ._M_head_impl)->patterns_degrees).
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  + (long)(int)(uint)sVar15 * 0x18) + (long)(int)uVar7 * 4);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar11,(int *)local_e0);
        }
        pvVar10 = std::
                  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                  ::at(&local_1d0,sVar15);
        pvVar11 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::at(pvVar10,uVar16);
        piVar4 = (pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pvVar10 = std::
                  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                  ::at(&local_1d0,sVar15);
        pvVar11 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::at(pvVar10,uVar16);
        std::
        __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                  (piVar4,(pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish);
        SVOBitset::~SVOBitset((SVOBitset *)local_180);
        uVar16 = uVar16 + 1;
      }
      sVar15 = (size_type)((int)local_1a0 + 1);
    }
  }
  uVar16 = 0;
LAB_00121bb1:
  __n = uVar16;
  if (__n < this->pattern_size) goto LAB_00121bc2;
  _Var12._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  if (*(long *)&((_Var12._M_head_impl)->proof).
                super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> != 0) {
    bVar6 = degree_and_nds_are_preserved((_Var12._M_head_impl)->params);
    _Var12._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    if ((bVar6) && (*(char *)((long)(_Var12._M_head_impl)->params + 0x8a) == '\0')) {
      for (uVar16 = 0; uVar16 < this->pattern_size; uVar16 = uVar16 + 1) {
        for (uVar7 = 0; uVar7 < this->target_size; uVar7 = uVar7 + 1) {
          pvVar9 = std::
                   vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                   ::at(domains,uVar16);
          bVar6 = SVOBitset::test(&pvVar9->values,uVar7);
          if (bVar6) {
            bVar6 = _check_degree_compatibility
                              (this,(int)uVar16,uVar7,uVar8,&local_1d0,&local_198,false);
            if (!bVar6) {
              pvVar9 = std::
                       vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                       ::at(domains,uVar16);
              SVOBitset::reset(&pvVar9->values,uVar7);
              pvVar9 = std::
                       vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                       ::at(domains,uVar16);
              puVar1 = &pvVar9->count;
              *puVar1 = *puVar1 - 1;
              if (*puVar1 == 0) {
                pPVar2 = (((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                          _M_head_impl)->proof).
                         super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                if (pPVar2 == (Proof *)0x0) goto LAB_00122232;
                pvVar9 = std::
                         vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                         ::at(domains,uVar16);
                uVar8 = pvVar9->v;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_180,"nds stage",(allocator<char> *)local_e0);
                Proof::initial_domain_is_empty(pPVar2,uVar8,(string *)local_180);
                goto LAB_00122228;
              }
            }
          }
        }
      }
      _Var12._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    }
  }
  bVar6 = is_nonshrinking((_Var12._M_head_impl)->params);
  if (!bVar6) {
LAB_00121f9c:
    pHVar14 = (domains->
              super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pHVar3 = (domains->
             super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      if (pHVar14 == pHVar3) {
        this_00 = *(Lackey **)
                   ((long)((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                          _M_head_impl)->params + 0xc0);
        if (this_00 != (Lackey *)0x0) {
          local_180._8_8_ = local_e0;
          local_e0._0_4_ = local_e0._0_4_ & 0xffffff00;
          local_168 = std::
                      _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:697:58)>
                      ::_M_invoke;
          local_180._16_8_ =
               std::
               _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:697:58)>
               ::_M_manager;
          local_180._0_8_ = domains;
          bVar6 = Lackey::reduce_initial_bounds(this_00,(RestrictRangeFunction *)local_180);
          uVar5 = local_e0._0_4_;
          std::_Function_base::~_Function_base((_Function_base *)local_180);
          bVar13 = false;
          if ((!bVar6) || ((uVar5 & 1) != 0)) goto LAB_00122234;
        }
        bVar13 = true;
        goto LAB_00122234;
      }
      uVar8 = SVOBitset::count(&pHVar14->values);
      pHVar14->count = uVar8;
      if ((uVar8 == 0) &&
         (pPVar2 = (((this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                     .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                    _M_head_impl)->proof).
                   super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         pPVar2 != (Proof *)0x0)) break;
      pHVar14 = pHVar14 + 1;
    }
    uVar8 = pHVar14->v;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_180,"post-initialisation stage",(allocator<char> *)local_e0);
    Proof::initial_domain_is_empty(pPVar2,uVar8,(string *)local_180);
    goto LAB_00122228;
  }
  SVOBitset::SVOBitset((SVOBitset *)local_180,this->target_size,0);
  pHVar3 = (domains->
           super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pHVar14 = (domains->
                 super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                 )._M_impl.super__Vector_impl_data._M_start; pHVar14 != pHVar3;
      pHVar14 = pHVar14 + 1) {
    SVOBitset::operator|=((SVOBitset *)local_180,&pHVar14->values);
  }
  uVar8 = SVOBitset::count((SVOBitset *)local_180);
  if (this->pattern_size <= uVar8) {
    SVOBitset::~SVOBitset((SVOBitset *)local_180);
    goto LAB_00121f9c;
  }
  if (*(long *)&(((this->_imp)._M_t.
                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl
                 )->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> != 0)
  {
    local_1b8.
    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8.
    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.
    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b8.
    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b8.
    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pHVar3 = (domains->
             super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pHVar14 = (domains->
                   super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                   )._M_impl.super__Vector_impl_data._M_start; pHVar14 != pHVar3;
        pHVar14 = pHVar14 + 1) {
      pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)local_e0,this,pHVar14->v);
      std::
      vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
      ::emplace_back<std::pair<int,std::__cxx11::string>>
                ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                  *)&local_f8,(NamedVertex *)local_e0);
      std::__cxx11::string::~string((string *)(local_e0 + 8));
    }
    SVOBitset::SVOBitset((SVOBitset *)local_e0,(SVOBitset *)local_180);
    uVar8 = SVOBitset::find_first((SVOBitset *)local_e0);
    while (uVar8 != 0xffffffff) {
      SVOBitset::reset((SVOBitset *)local_e0,uVar8);
      target_vertex_for_proof_abi_cxx11_((NamedVertex *)local_58,this,uVar8);
      std::
      vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
      ::emplace_back<std::pair<int,std::__cxx11::string>>
                ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                  *)&local_1b8,(NamedVertex *)local_58);
      std::__cxx11::string::~string((string *)(local_58 + 8));
      uVar8 = SVOBitset::find_first((SVOBitset *)local_e0);
    }
    Proof::emit_hall_set_or_violator
              ((((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)
               ->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_f8,&local_1b8);
    SVOBitset::~SVOBitset((SVOBitset *)local_e0);
    std::
    vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_1b8);
    std::
    vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_f8);
  }
  SVOBitset::~SVOBitset((SVOBitset *)local_180);
  goto LAB_00122232;
LAB_00121bc2:
  pvVar9 = std::
           vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
           ::at(domains,__n);
  uVar7 = (uint)__n;
  pvVar9->v = uVar7;
  pvVar9 = std::
           vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
           ::at(domains,__n);
  SVOBitset::reset(&pvVar9->values);
  for (t = 0; t < this->target_size; t = t + 1) {
    bVar6 = _check_label_compatibility(this,uVar7,t);
    if (bVar6) {
      bVar6 = _check_loop_compatibility(this,uVar7,t);
      if (bVar6) {
        bVar6 = _check_degree_compatibility
                          (this,uVar7,t,uVar8,&local_1d0,&local_198,
                           *(long *)&(((this->_imp)._M_t.
                                       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                       .
                                       super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                      ._M_head_impl)->proof).
                                     super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                           != 0);
        if (bVar6) {
          bVar6 = _check_clique_compatibility(this,uVar7,t);
          if (bVar6) {
            pvVar9 = std::
                     vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                     ::at(domains,__n);
            SVOBitset::set(&pvVar9->values,t);
          }
        }
      }
    }
  }
  pvVar9 = std::
           vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
           ::at(domains,__n);
  uVar7 = SVOBitset::count(&pvVar9->values);
  pvVar9 = std::
           vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
           ::at(domains,__n);
  pvVar9->count = uVar7;
  pvVar9 = std::
           vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
           ::at(domains,__n);
  uVar16 = __n + 1;
  if (pvVar9->count == 0) {
    pPVar2 = (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
             proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (pPVar2 != (Proof *)0x0) {
      pvVar9 = std::
               vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
               ::at(domains,__n);
      uVar8 = pvVar9->v;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_180,"compatibility stage",(allocator<char> *)local_e0);
      Proof::initial_domain_is_empty(pPVar2,uVar8,(string *)local_180);
LAB_00122228:
      std::__cxx11::string::~string((string *)local_180);
    }
LAB_00122232:
    bVar13 = false;
LAB_00122234:
    std::
    vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
    ::~vector(&local_198);
    std::
    vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
    ::~vector(&local_1d0);
    return bVar13;
  }
  goto LAB_00121bb1;
}

Assistant:

auto HomomorphismModel::initialise_domains(vector<HomomorphismDomain> & domains) const -> bool
{
    unsigned max_graphs_for_degree_things = (_imp->params.injectivity == Injectivity::LocallyInjective ? 1 : max_graphs);

    /* pattern and target neighbourhood degree sequences */
    vector<vector<vector<int>>> patterns_ndss(max_graphs_for_degree_things);
    vector<vector<optional<vector<int>>>> targets_ndss(max_graphs_for_degree_things);

    if (degree_and_nds_are_preserved(_imp->params) && ! _imp->params.no_nds) {
        for (unsigned g = 0; g < max_graphs_for_degree_things; ++g) {
            patterns_ndss.at(g).resize(pattern_size);
            targets_ndss.at(g).resize(target_size);
        }

        for (unsigned g = 0; g < max_graphs_for_degree_things; ++g) {
            for (unsigned i = 0; i < pattern_size; ++i) {
                auto ni = pattern_graph_row(g, i);
                for (auto j = ni.find_first(); j != decltype(ni)::npos; j = ni.find_first()) {
                    ni.reset(j);
                    patterns_ndss.at(g).at(i).push_back(pattern_degree(g, j));
                }
                sort(patterns_ndss.at(g).at(i).begin(), patterns_ndss.at(g).at(i).end(), greater<int>());
            }
        }
    }

    for (unsigned i = 0; i < pattern_size; ++i) {
        domains.at(i).v = i;
        domains.at(i).values.reset();

        for (unsigned j = 0; j < target_size; ++j) {
            bool ok = true;

            if (! _check_label_compatibility(i, j))
                ok = false;
            else if (! _check_loop_compatibility(i, j))
                ok = false;
            else if (! _check_degree_compatibility(i, j, max_graphs_for_degree_things, patterns_ndss, targets_ndss, _imp->proof.get()))
                ok = false;
            else if (! _check_clique_compatibility(i, j))
                ok = false;

            if (ok)
                domains.at(i).values.set(j);
        }

        domains.at(i).count = domains.at(i).values.count();
        if (0 == domains.at(i).count) {
            if (_imp->proof)
                _imp->proof->initial_domain_is_empty(domains.at(i).v, "compatibility stage");
            return false;
        }
    }

    // for proof logging, we need degree information before we can output nds proofs
    if (_imp->proof && degree_and_nds_are_preserved(_imp->params) && ! _imp->params.no_nds) {
        for (unsigned i = 0; i < pattern_size; ++i) {
            for (unsigned j = 0; j < target_size; ++j) {
                if (domains.at(i).values.test(j) &&
                    ! _check_degree_compatibility(i, j, max_graphs_for_degree_things, patterns_ndss, targets_ndss, false)) {
                    domains.at(i).values.reset(j);
                    if (0 == --domains.at(i).count) {
                        if (_imp->proof)
                            _imp->proof->initial_domain_is_empty(domains.at(i).v, "nds stage");
                        return false;
                    }
                }
            }
        }
    }

    // quick sanity check that we have enough values
    if (is_nonshrinking(_imp->params)) {
        SVOBitset domains_union{target_size, 0};
        for (auto & d : domains)
            domains_union |= d.values;

        unsigned domains_union_popcount = domains_union.count();
        if (domains_union_popcount < unsigned(pattern_size)) {
            if (_imp->proof) {
                vector<NamedVertex> hall_lhs, hall_rhs;
                for (auto & d : domains)
                    hall_lhs.push_back(pattern_vertex_for_proof(d.v));
                auto dd = domains_union;
                for (auto v = dd.find_first(); v != decltype(dd)::npos; v = dd.find_first()) {
                    dd.reset(v);
                    hall_rhs.push_back(target_vertex_for_proof(v));
                }
                _imp->proof->emit_hall_set_or_violator(hall_lhs, hall_rhs);
            }
            return false;
        }
    }

    for (auto & d : domains) {
        d.count = d.values.count();
        if (0 == d.count && _imp->proof) {
            _imp->proof->initial_domain_is_empty(d.v, "post-initialisation stage");
            return false;
        }
    }

    if (_imp->params.lackey) {
        // If we're dealing with a model from Essence, it's possible some values will
        // be completely eliminated from the upper and lower bounds of certain domains,
        // in which case they won't show up as being deleted during propagation.
        bool wipeout = false;
        if (! _imp->params.lackey->reduce_initial_bounds([&](int p, int t) -> void {
                for (auto & d : domains)
                    if (d.v == unsigned(p)) {
                        if (d.values.test(t)) {
                            d.values.reset(t);
                            if (0 == --d.count)
                                wipeout = true;
                        }
                        break;
                    }
            }) ||
            wipeout) {
            return false;
        }
    }

    return true;
}